

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.h
# Opt level: O3

void __thiscall
ReindexCommand::ReindexCommand
          (ReindexCommand *this,string *dataset_id,
          vector<IndexType,_std::allocator<IndexType>_> *types)

{
  pointer pcVar1;
  
  (this->dataset_id_)._M_dataplus._M_p = (pointer)&(this->dataset_id_).field_2;
  pcVar1 = (dataset_id->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + dataset_id->_M_string_length);
  std::vector<IndexType,_std::allocator<IndexType>_>::vector
            ((vector<IndexType,_std::allocator<IndexType>_> *)&this->types_,types);
  return;
}

Assistant:

ReindexCommand(const std::string &dataset_id,
                   const std::vector<IndexType> &types)
        : dataset_id_(dataset_id), types_(types) {}